

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestNetwork::~TestNetwork(TestNetwork *this)

{
  HashBucket *pHVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Entry *pEVar4;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar5;
  Entry *pEVar6;
  Entry *pEVar7;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *pRVar8;
  Entry *pEVar9;
  
  pHVar1 = (this->map).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->map).table.indexes.buckets.size_;
    (this->map).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->map).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->map).table.indexes.buckets.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar4 = (this->map).table.rows.builder.ptr;
  if (pEVar4 != (Entry *)0x0) {
    pRVar5 = (this->map).table.rows.builder.pos;
    pEVar6 = (this->map).table.rows.builder.endPtr;
    (this->map).table.rows.builder.ptr = (Entry *)0x0;
    (this->map).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
          *)0x0;
    (this->map).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->map).table.rows.builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pEVar4,0x20,(long)pRVar5 - (long)pEVar4 >> 5,(long)pEVar6 - (long)pEVar4 >> 5,
               kj::ArrayDisposer::
               Dispose_<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
               ::destruct);
  }
  pHVar1 = (this->dumper).schemas.table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->dumper).schemas.table.indexes.buckets.size_;
    (this->dumper).schemas.table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->dumper).schemas.table.indexes.buckets.size_ = 0;
    pAVar3 = (this->dumper).schemas.table.indexes.buckets.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar7 = (this->dumper).schemas.table.rows.builder.ptr;
  if (pEVar7 != (Entry *)0x0) {
    pRVar8 = (this->dumper).schemas.table.rows.builder.pos;
    pEVar9 = (this->dumper).schemas.table.rows.builder.endPtr;
    (this->dumper).schemas.table.rows.builder.ptr = (Entry *)0x0;
    (this->dumper).schemas.table.rows.builder.pos =
         (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
    (this->dumper).schemas.table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->dumper).schemas.table.rows.builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pEVar7,0x10,(long)pRVar8 - (long)pEVar7 >> 4,(long)pEVar9 - (long)pEVar7 >> 4,
               0);
    return;
  }
  return;
}

Assistant:

TestNetwork::~TestNetwork() noexcept(false) {}